

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterOperations.cpp
# Opt level: O1

void __thiscall
helics::CloneFilterOperation::set(CloneFilterOperation *this,string_view property,double param_2)

{
  HelicsException *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  undefined8 uVar3;
  string_view message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  size_type *local_50;
  size_type local_48;
  size_type local_40;
  undefined8 uStack_38;
  
  this_00 = (HelicsException *)__cxa_allocate_exception(SUB84(param_2,0),0x28);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"property ","");
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,property._M_str,property._M_str + property._M_len);
  uVar3 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    uVar3 = local_70.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar3 < local_90._M_string_length + local_70._M_string_length) {
    uVar3 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      uVar3 = local_90.field_2._M_allocated_capacity;
    }
    if (local_90._M_string_length + local_70._M_string_length <= (ulong)uVar3) {
      pbVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::replace(&local_90,0,0,local_70._M_dataplus._M_p,local_70._M_string_length);
      goto LAB_00270000;
    }
  }
  pbVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_70,local_90._M_dataplus._M_p,local_90._M_string_length);
LAB_00270000:
  local_b0._M_dataplus._M_p = (pbVar1->_M_dataplus)._M_p;
  paVar2 = &pbVar1->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p == paVar2) {
    local_b0.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
    local_b0.field_2._8_8_ = *(undefined8 *)((long)&pbVar1->field_2 + 8);
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  }
  else {
    local_b0.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  local_b0._M_string_length = pbVar1->_M_string_length;
  (pbVar1->_M_dataplus)._M_p = (pointer)paVar2;
  pbVar1->_M_string_length = 0;
  paVar2->_M_local_buf[0] = '\0';
  pbVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           append(&local_b0," is not a known property");
  local_50 = (size_type *)(pbVar1->_M_dataplus)._M_p;
  paVar2 = &pbVar1->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50 == paVar2) {
    local_40 = paVar2->_M_allocated_capacity;
    uStack_38 = *(undefined8 *)((long)&pbVar1->field_2 + 8);
    local_50 = &local_40;
  }
  else {
    local_40 = paVar2->_M_allocated_capacity;
  }
  local_48 = pbVar1->_M_string_length;
  (pbVar1->_M_dataplus)._M_p = (pointer)paVar2;
  pbVar1->_M_string_length = 0;
  (pbVar1->field_2)._M_local_buf[0] = '\0';
  message._M_str = (char *)local_50;
  message._M_len = local_48;
  HelicsException::HelicsException(this_00,message);
  *(undefined ***)this_00 = &PTR__HelicsException_00522bc0;
  __cxa_throw(this_00,&InvalidParameter::typeinfo,HelicsException::~HelicsException);
}

Assistant:

void CloneFilterOperation::set(std::string_view property, double /*val*/)
{
    throw(helics::InvalidParameter(std::string("property ") + std::string(property) +
                                   " is not a known property"));
}